

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)>::OnCallSpec
          (OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> *this,char *a_file,
          int a_line,ArgumentMatcherTuple *matchers)

{
  (this->super_UntypedOnCallSpecBase).file_ = a_file;
  (this->super_UntypedOnCallSpecBase).line_ = a_line;
  (this->super_UntypedOnCallSpecBase).last_clause_ = kNone;
  Matcher<fmt::v5::basic_string_view<wchar_t>_>::Matcher(&(this->matchers_).f0_,&matchers->f0_);
  A<std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,void,void,void,void,void,void,void,void,void>const&>
            ();
  (this->action_).impl_.value_ =
       (ActionInterface<test_result_(fmt::v5::basic_string_view<wchar_t>)> *)0x0;
  (this->action_).impl_.link_.next_ = &(this->action_).impl_.link_;
  return;
}

Assistant:

OnCallSpec(const char* a_file, int a_line,
             const ArgumentMatcherTuple& matchers)
      : UntypedOnCallSpecBase(a_file, a_line),
        matchers_(matchers),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()) {
  }